

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::next(Session *this,string *msg,UtcTimeStamp *timeStamp,bool queued)

{
  pointer pcVar1;
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  char local_168 [16];
  _Alloc_hider local_158;
  _Base_ptr local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  size_t local_138;
  int local_130;
  
  SessionState::onIncoming(&this->m_state,msg);
  dataDictionary =
       DataDictionaryProvider::getSessionDataDictionary
                 (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
  if ((this->m_sessionID).m_isFIXT == true) {
    local_188._0_8_ = &PTR__FieldBase_001ed588;
    local_188._8_4_ = 0x468;
    local_178._M_p = local_168;
    pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar1,
               pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length);
    local_158._M_p = (pointer)&local_148;
    local_150 = (_Base_ptr)0x0;
    local_148._M_local_buf[0] = '\0';
    local_138 = 0;
    local_130 = 0;
    local_188._0_8_ = &PTR__FieldBase_001eefe0;
    applicationDataDictionary =
         DataDictionaryProvider::getApplicationDataDictionary
                   (&this->m_dataDictionaryProvider,(ApplVerID *)local_188);
    FieldBase::~FieldBase((FieldBase *)local_188);
    Message::Message((Message *)local_188,msg,dataDictionary,applicationDataDictionary,
                     this->m_validateLengthAndChecksum);
    next(this,(Message *)local_188,timeStamp,queued);
  }
  else {
    Message::Message((Message *)local_188,msg,dataDictionary,this->m_validateLengthAndChecksum);
    next(this,(Message *)local_188,timeStamp,queued);
  }
  Message::~Message((Message *)local_188);
  return;
}

Assistant:

void Session::next( const std::string& msg, const UtcTimeStamp& timeStamp, bool queued )
{
  try
  {
    m_state.onIncoming( msg );
    const DataDictionary& sessionDD = 
      m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if( m_sessionID.isFIXT() )
    {
      const DataDictionary& applicationDD =
        m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      next( Message( msg, sessionDD, applicationDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
    else
    {
      next( Message( msg, sessionDD, m_validateLengthAndChecksum ), timeStamp, queued );
    }
  }
  catch( InvalidMessage& e )
  {
    m_state.onEvent( e.what() );

    try
    {
      if( identifyType(msg) == MsgType_Logon )
      {
        m_state.onEvent( "Logon message is not valid" );
        disconnect();
      }
    } catch( MessageParseError& ) {}
    throw e;
  }
}